

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v8::detail::
for_each_codepoint<fmt::v8::detail::compute_width(fmt::v8::basic_string_view<char>)::count_code_points>
          (detail *this,string_view s,count_code_points f)

{
  bool bVar1;
  uint uVar2;
  detail *__src;
  char *pcVar3;
  char *pcVar4;
  detail *pdVar5;
  size_t sVar6;
  detail *pdVar7;
  type size;
  size_t __n;
  byte *pbVar8;
  string_view sVar9;
  string_view sVar10;
  byte local_48 [8];
  char buf [7];
  count_code_points local_38;
  anon_class_8_1_54a39806 decode;
  
  local_38.count = (size_t *)s.size_;
  pcVar3 = s.data_;
  __src = this;
  pcVar4 = pcVar3;
  if ((char *)0x3 < pcVar3) {
    pdVar7 = this;
    _buf = pcVar3;
    do {
      pdVar5 = pdVar7;
      __src = pdVar5;
      if ((detail *)(pcVar3 + (long)this + -3) <= pdVar5) break;
      sVar6 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                    [(byte)*pdVar5 >> 3] +
              (ulong)((long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                            [(byte)*pdVar5 >> 3] == 0);
      uVar2 = ((byte)pdVar5[3] & 0x3f |
              ((byte)pdVar5[2] & 0x3f) << 6 |
              ((byte)pdVar5[1] & 0x3f) << 0xc |
              ((int)(char)*pdVar5 & *(uint *)(&DAT_001f67f0 + sVar6 * 4)) << 0x12) >>
              ((&DAT_001f6830)[sVar6 * 4] & 0x1f);
      sVar9.size_ = sVar6;
      sVar9.data_ = (char *)pdVar5;
      bVar1 = anon_func::count_code_points::operator()
                        (&local_38,
                         -(uint)(((((byte)pdVar5[1] >> 2 & 0xfffffff0) +
                                   (uint)((byte)pdVar5[2] >> 6) * 4 | (uint)((byte)pdVar5[3] >> 6) |
                                   (uint)(uVar2 < *(uint *)(&DAT_001f6810 + sVar6 * 4)) << 6 |
                                   (uint)(0x10ffff < uVar2) << 8 |
                                  (uint)((uVar2 & 0xfffff800) == 0xd800) << 7) ^ 0x2a) >>
                                 ((&DAT_001f6850)[sVar6 * 4] & 0x1f) != 0) | uVar2,sVar9);
      if (bVar1) {
        pdVar7 = pdVar5 + sVar6;
      }
      else {
        pdVar7 = (detail *)0x0;
      }
      __src = (detail *)0x0;
    } while (pdVar7 != (detail *)0x0);
    pcVar4 = _buf;
    if (pdVar5 < (detail *)(pcVar3 + (long)this + -3)) {
      return;
    }
  }
  __n = (long)(this + (long)pcVar4) - (long)__src;
  if (__n != 0) {
    local_48[4] = 0;
    local_48[5] = 0;
    local_48[6] = 0;
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    memcpy(local_48,__src,__n);
    pbVar8 = local_48;
    do {
      sVar6 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[*pbVar8 >> 3]
              + (ulong)((long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                              [*pbVar8 >> 3] == 0);
      uVar2 = (pbVar8[3] & 0x3f |
              (pbVar8[2] & 0x3f) << 6 |
              (pbVar8[1] & 0x3f) << 0xc |
              ((int)(char)*pbVar8 & *(uint *)(&DAT_001f67f0 + sVar6 * 4)) << 0x12) >>
              ((&DAT_001f6830)[sVar6 * 4] & 0x1f);
      sVar10.size_ = sVar6;
      sVar10.data_ = (char *)__src;
      bVar1 = anon_func::count_code_points::operator()
                        (&local_38,
                         -(uint)((((pbVar8[1] >> 2 & 0xfffffff0) + (uint)(pbVar8[2] >> 6) * 4 |
                                   (uint)(pbVar8[3] >> 6) |
                                   (uint)(uVar2 < *(uint *)(&DAT_001f6810 + sVar6 * 4)) << 6 |
                                   (uint)(0x10ffff < uVar2) << 8 |
                                  (uint)((uVar2 & 0xfffff800) == 0xd800) << 7) ^ 0x2a) >>
                                 ((&DAT_001f6850)[sVar6 * 4] & 0x1f) != 0) | uVar2,sVar10);
      if (!bVar1) {
        return;
      }
      pbVar8 = pbVar8 + sVar6;
      __src = __src + sVar6;
    } while ((long)pbVar8 - (long)local_48 < (long)__n);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* buf_ptr, const char* ptr) {
    auto cp = uint32_t();
    auto error = 0;
    auto end = utf8_decode(buf_ptr, &cp, &error);
    bool result = f(error ? invalid_code_point : cp,
                    string_view(ptr, to_unsigned(end - buf_ptr)));
    return result ? end : nullptr;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) {
      p = decode(p, p);
      if (!p) return;
    }
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    copy_str<char>(p, p + num_chars_left, buf);
    const char* buf_ptr = buf;
    do {
      auto end = decode(buf_ptr, p);
      if (!end) return;
      p += end - buf_ptr;
      buf_ptr = end;
    } while (buf_ptr - buf < num_chars_left);
  }
}